

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O0

bool anon_unknown.dwarf_1d2162::readfile
               (Schema scheme,FrameBuffer *buf,FrameBuffer *preread,FrameBuffer *postread)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  InputFile infile;
  bool in_stack_00000127;
  FrameBuffer *in_stack_00000128;
  PixelType *in_stack_00000130;
  char **in_stack_00000138;
  char **in_stack_00000140;
  Header *in_stack_00000148;
  FrameBuffer *in_stack_00000160;
  FrameBuffer *in_stack_00000168;
  int in_stack_00000170;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::InputFile::InputFile((InputFile *)&stack0xffffffffffffffd8,pcVar3,iVar2);
  Imf_3_2::InputFile::header();
  setupBuffer(in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000130,
              in_stack_00000128,in_stack_00000160,in_stack_00000168,in_stack_00000170,
              in_stack_00000127);
  Imf_3_2::ChannelList::~ChannelList((ChannelList *)0x203c0f);
  Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)&stack0xffffffffffffffd8);
  std::ostream::flush();
  Imf_3_2::InputFile::header();
  lVar4 = Imf_3_2::Header::dataWindow();
  iVar2 = *(int *)(lVar4 + 4);
  Imf_3_2::InputFile::header();
  Imf_3_2::Header::dataWindow();
  Imf_3_2::InputFile::readPixels((int)&stack0xffffffffffffffd8,iVar2);
  bVar1 = Imf_3_2::InputFile::isOptimizationEnabled();
  Imf_3_2::InputFile::~InputFile((InputFile *)&stack0xffffffffffffffd8);
  return (bool)(bVar1 & 1);
}

Assistant:

bool
readfile (
    Schema       scheme,
    FrameBuffer& buf,     ///< list of channels to read: index to readingBuffer
    FrameBuffer& preread, ///< list of channels to skip: index to preReadBuffer
    FrameBuffer&
        postread) ///< list of channels to skip: index to readingBuffer)
{
    InputFile infile (filename.c_str ());
    setupBuffer (
        infile.header (),
        scheme._active,
        scheme._passive,
        scheme._types,
        buf,
        preread,
        postread,
        scheme._banks,
        false);
    infile.setFrameBuffer (buf);

    cout.flush ();
    infile.readPixels (
        infile.header ().dataWindow ().min.y,
        infile.header ().dataWindow ().max.y);

    return infile.isOptimizationEnabled ();
}